

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

ostream * std::operator<<(ostream *ofs,StringData *v)

{
  string local_38;
  StringData *local_18;
  StringData *v_local;
  ostream *ofs_local;
  
  local_18 = v;
  v_local = (StringData *)ofs;
  tinyusdz::buildEscapedAndQuotedStringForUSDA(&local_38,&v->value);
  std::operator<<(ofs,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return (ostream *)v_local;
}

Assistant:

std::ostream &operator<<(std::ostream &ofs,
                         const tinyusdz::value::StringData &v) {
#if 0
  std::string delim = v.single_quote ? "'" : "\"";

  if (v.is_triple_quoted) {
    if (v.single_quote) {
      if (tinyusdz::hasEscapedTripleQuotes(v.value, /* double quote */false)) {
        // Change to use """
        delim = "\"\"\"";
      } else {
        delim = "'''";
      }
    } else {
      delim = "\"\"\"";
    }
  }

  ofs << delim;
  ofs << tinyusdz::escapeBackslash(v.value, v.is_triple_quoted);
  ofs << delim;
#else
  ofs << tinyusdz::buildEscapedAndQuotedStringForUSDA(v.value);
#endif

  return ofs;
}